

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_raytracing_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  Impl *pIVar1;
  VkPipelineBinaryInfoKHR *pVVar2;
  ulong uVar3;
  VkPipelineShaderStageCreateInfo *stage;
  VkPipelineShaderStageCreateInfo *this_00;
  bool bVar4;
  VkRayTracingPipelineCreateInfoKHR *new_info;
  WorkItem local_50;
  
  stage = (VkPipelineShaderStageCreateInfo *)pipeline;
  pVVar2 = find_pnext<VkPipelineBinaryInfoKHR>((VkStructureType)create_info->pNext,pipeline);
  if ((pVVar2 == (VkPipelineBinaryInfoKHR *)0x0) || (bVar4 = true, pVVar2->binaryCount == 0)) {
    uVar3 = (ulong)create_info->stageCount;
    this_00 = create_info->pStages;
    pIVar1 = this->impl;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      bVar4 = shader_stage_is_identifier_only((Fossilize *)this_00,stage);
      if ((bVar4) && (pIVar1->should_record_identifier_only == false)) {
        std::mutex::lock(&pIVar1->record_lock);
        if (pipeline != (VkPipeline)0x0) {
          Impl::push_unregister_locked<VkPipeline_T*>
                    (this->impl,VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,pipeline);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
        goto LAB_00117cb5;
      }
      this_00 = this_00 + 1;
    }
    std::mutex::lock(&pIVar1->record_lock);
    new_info = (VkRayTracingPipelineCreateInfoKHR *)0x0;
    bVar4 = Impl::copy_raytracing_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&new_info);
    if (bVar4) {
      local_50.type = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
      local_50.create_info = new_info;
      local_50.handle = (uint64_t)pipeline;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
    }
    else if (pipeline != (VkPipeline)0x0) {
      Impl::push_unregister_locked<VkPipeline_T*>
                (this->impl,VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,pipeline);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
    if (bVar4) {
      Impl::pump_synchronized_recording(this->impl,this);
LAB_00117cb5:
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool StateRecorder::record_raytracing_pipeline(
		VkPipeline pipeline, const VkRayTracingPipelineCreateInfoKHR &create_info,
		const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
		Hash custom_hash,
		VkDevice device,
		PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// If we are using module identifier data + on use, we need to push it for record.
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
		    !impl->should_record_identifier_only)
		{
			std::lock_guard<std::mutex> lock(impl->record_lock);
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR, pipeline);
			return true;
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkRayTracingPipelineCreateInfoKHR *new_info = nullptr;
		if (!impl->copy_raytracing_pipeline(&create_info, impl->temp_allocator,
		                                    base_pipelines, base_pipeline_count,
		                                    device, gsmcii,
		                                    &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,
		                        api_object_cast<uint64_t>(pipeline), new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}